

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereLoopAddBtree(WhereLoopBuilder *pBuilder,Bitmask mPrereq)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  ushort uVar5;
  WhereLoop *pTemplate;
  SrcList *pSVar6;
  Table *pTVar7;
  WhereTerm *pWVar8;
  ExprList *pEVar9;
  WhereTerm *pTerm;
  bool bVar10;
  u8 uVar11;
  LogEst LVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined6 extraout_var;
  uint uVar17;
  ulong uVar18;
  Expr *pA;
  ExprList_item *pEVar19;
  ulong uVar20;
  ulong uVar21;
  WhereTerm *pWVar22;
  long lVar23;
  Index *pIdx;
  long lVar24;
  bool bVar25;
  i16 aiColumnPk;
  LogEst aiRowEstPk [2];
  Index sPk;
  uint local_fc;
  i16 local_d2;
  ulong local_d0;
  WhereClause *local_c8;
  WhereInfo *local_c0;
  ExprList_item *local_b8;
  Bitmask local_b0;
  ExprList *local_a8;
  LogEst local_9c [2];
  Index local_98;
  
  local_d2 = -1;
  pTemplate = pBuilder->pNew;
  local_c0 = pBuilder->pWInfo;
  pSVar6 = local_c0->pTabList;
  bVar2 = pTemplate->iTab;
  pTVar7 = pSVar6->a[bVar2].pTab;
  pIdx = pSVar6->a[bVar2].pIBIndex;
  if (pIdx == (Index *)0x0) {
    if ((pTVar7->tabFlags & 0x20) == 0) {
      pIdx = &local_98;
      local_98.aColExpr = (ExprList *)0x0;
      local_98.zName = (char *)0x0;
      local_98.azColl = (char **)0x0;
      local_98.pPartIdxWhere = (Expr *)0x0;
      local_98.pSchema = (Schema *)0x0;
      local_98.aSortOrder = (u8 *)0x0;
      local_98.zColAff = (char *)0x0;
      local_98.pNext = (Index *)0x0;
      local_98.aiColumn = &local_d2;
      local_98.aiRowLogEst = local_9c;
      local_98.nColumn = 1;
      local_98.onError = '\x05';
      local_98._99_5_ = 0;
      local_98.pTable = pTVar7;
      local_98._88_6_ = (uint6)(ushort)pTVar7->szTabRow << 0x20;
      local_98.nKeyCol = 1;
      local_9c[0] = pTVar7->nRowLogEst;
      local_9c[1] = 0;
      if ((pSVar6->a[bVar2].fg.field_0x1 & 1) == 0) {
        local_98.pNext = (pSVar6->a[bVar2].pTab)->pIndex;
      }
    }
    else {
      pIdx = pTVar7->pIndex;
    }
  }
  local_c8 = pBuilder->pWC;
  sVar4 = pTVar7->nRowLogEst;
  iVar16 = 0;
  iVar13 = 0;
  local_b0 = mPrereq;
  if (10 < (long)sVar4) {
    LVar12 = sqlite3LogEst((long)sVar4);
    iVar13 = (int)CONCAT62(extraout_var,LVar12) + -0x21;
  }
  iVar15 = 0;
  if ((((pBuilder->pOrSet == (WhereOrSet *)0x0) &&
       (iVar15 = iVar16, (local_c0->wctrlFlags & 0x20) == 0)) &&
      ((local_c0->pParse->db->flags & 0x8000) != 0)) &&
     (((pSVar6->a[bVar2].pIBIndex == (Index *)0x0 &&
       (bVar3 = pSVar6->a[bVar2].fg.field_0x1, (bVar3 & 1) == 0)) &&
      (((bVar3 & 0x28) == 0 &&
       (((pTVar7->tabFlags & 0x20) == 0 && (iVar16 = local_c8->nTerm, 0 < (long)iVar16)))))))) {
    pWVar8 = local_c8->a;
    local_b8 = (ExprList_item *)CONCAT44(local_b8._4_4_,iVar13 + sVar4 + 0x1c);
    pTerm = pWVar8;
    do {
      pWVar22 = pTerm + 1;
      iVar15 = 0;
      if ((pTerm->prereqRight & pTemplate->maskSelf) == 0) {
        iVar15 = 0;
        iVar14 = termCanDriveIndex(pTerm,pSVar6->a + bVar2,0);
        if (iVar14 != 0) {
          (pTemplate->u).btree.nEq = 1;
          (pTemplate->u).btree.pIndex = (Index *)0x0;
          pTemplate->nLTerm = 1;
          pTemplate->nSkip = 0;
          *pTemplate->aLTerm = pTerm;
          pTemplate->rSetup = (short)iVar13 + sVar4 + 4;
          if ((pTVar7->pSelect == (Select *)0x0) && ((pTVar7->tabFlags & 2) == 0)) {
            pTemplate->rSetup = (LogEst)local_b8;
          }
          if (pTemplate->rSetup < 0) {
            pTemplate->rSetup = 0;
          }
          pTemplate->nOut = 0x2b;
          LVar12 = sqlite3LogEstAdd((short)iVar13,0x2b);
          pTemplate->rRun = LVar12;
          pTemplate->wsFlags = 0x4000;
          pTemplate->prereq = pTerm->prereqRight | local_b0;
          iVar15 = whereLoopInsert(pBuilder,pTemplate);
        }
      }
    } while ((iVar15 == 0) && (pTerm = pWVar22, pWVar22 < pWVar8 + iVar16));
  }
  if ((iVar15 == 0) && (pIdx != (Index *)0x0)) {
    local_fc = 1;
    do {
      if ((pIdx->pPartIdxWhere == (Expr *)0x0) ||
         (iVar13 = whereUsablePartialIndex(pSVar6->a[bVar2].iCursor,local_c8,pIdx->pPartIdxWhere),
         iVar13 != 0)) {
        uVar5 = *pIdx->aiRowLogEst;
        uVar20 = (ulong)uVar5;
        (pTemplate->u).vtab.idxNum = 0;
        (pTemplate->u).btree.nTop = 0;
        pTemplate->nLTerm = 0;
        pTemplate->nSkip = 0;
        pTemplate->iSortIdx = '\0';
        pTemplate->rSetup = 0;
        pTemplate->prereq = local_b0;
        pTemplate->nOut = uVar5;
        (pTemplate->u).btree.pIndex = pIdx;
        bVar10 = true;
        if (((pIdx->field_0x63 & 4) == 0) &&
           ((pEVar9 = pBuilder->pWInfo->pOrderBy, pEVar9 != (ExprList *)0x0 && (0 < pEVar9->nExpr)))
           ) {
          iVar13 = pSVar6->a[bVar2].iCursor;
          local_b8 = pEVar9->a;
          lVar23 = 0;
          local_d0 = uVar20;
          local_a8 = pEVar9;
          do {
            pA = local_b8[lVar23].pExpr;
            while ((pA != (Expr *)0x0 && ((pA->flags >> 0xc & 1) != 0))) {
              if ((pA->flags >> 0x12 & 1) == 0) {
                pEVar19 = (ExprList_item *)&pA->pLeft;
              }
              else {
                pEVar19 = ((pA->x).pList)->a;
              }
              pA = pEVar19->pExpr;
            }
            if ((pA->op == 0x98) && (pA->iTable == iVar13)) {
              if (pA->iColumn < 0) {
LAB_00172c14:
                bVar10 = false;
                uVar20 = local_d0;
                goto LAB_00172c2e;
              }
              if ((ulong)pIdx->nKeyCol != 0) {
                uVar20 = 0;
                do {
                  if (pA->iColumn == pIdx->aiColumn[uVar20]) goto LAB_00172c14;
                  uVar20 = uVar20 + 1;
                } while (pIdx->nKeyCol != uVar20);
              }
            }
            else if ((pIdx->aColExpr != (ExprList *)0x0) && (pIdx->nKeyCol != 0)) {
              pEVar19 = pIdx->aColExpr->a;
              uVar20 = 0;
              do {
                if ((pIdx->aiColumn[uVar20] == -2) &&
                   (iVar16 = sqlite3ExprCompare((Parse *)0x0,pA,pEVar19->pExpr,iVar13), iVar16 == 0)
                   ) goto LAB_00172c14;
                uVar20 = uVar20 + 1;
                pEVar19 = pEVar19 + 1;
              } while (uVar20 < pIdx->nKeyCol);
            }
            lVar23 = lVar23 + 1;
          } while (lVar23 < local_a8->nExpr);
          bVar10 = true;
          uVar20 = local_d0;
        }
LAB_00172c2e:
        LVar12 = (LogEst)uVar20;
        if (pIdx->tnum < 1) {
          uVar20 = (ulong)local_fc;
          if (bVar10) {
            uVar20 = 0;
          }
          pTemplate->wsFlags = 0x100;
          pTemplate->iSortIdx = (u8)uVar20;
          pTemplate->rRun = LVar12 + 0x10;
          whereLoopOutputAdjust(local_c8,pTemplate,LVar12);
          iVar13 = whereLoopInsert(pBuilder,pTemplate);
          pTemplate->nOut = LVar12;
          if (iVar13 != 0) {
            return iVar13;
          }
        }
        else {
          if ((pIdx->field_0x63 & 0x20) == 0) {
            if ((ulong)pIdx->nColumn == 0) {
              uVar18 = 0xffffffffffffffff;
            }
            else {
              lVar23 = (ulong)pIdx->nColumn + 1;
              uVar18 = 0;
              do {
                uVar21 = 1L << ((byte)pIdx->aiColumn[lVar23 + -2] & 0x3f);
                if (0x3e < (ushort)pIdx->aiColumn[lVar23 + -2]) {
                  uVar21 = 0;
                }
                uVar18 = uVar18 | uVar21;
                lVar23 = lVar23 + -1;
              } while (1 < lVar23);
              uVar18 = ~uVar18;
            }
            bVar25 = (pSVar6->a[bVar2].colUsed & uVar18) == 0;
            pTemplate->wsFlags = (bVar25 | 8) << 6;
          }
          else {
            pTemplate->wsFlags = 0x240;
            bVar25 = true;
          }
          uVar11 = (u8)local_fc;
          if (bVar10) {
            uVar11 = '\0';
            if ((((pTVar7->tabFlags & 0x20) != 0) || (pIdx->pPartIdxWhere != (Expr *)0x0)) ||
               ((bVar25 &&
                (((((pIdx->field_0x63 & 4) == 0 && (pIdx->szIdxRow < pTVar7->szTabRow)) &&
                  ((local_c0->wctrlFlags & 4) == 0)) &&
                 ((sqlite3Config.bUseCis != 0 &&
                  (uVar11 = '\0', (local_c0->pParse->db->dbOptFlags & 0x40) == 0))))))))
            goto LAB_00172d16;
LAB_00172e56:
            bVar10 = true;
            iVar13 = 0;
          }
          else {
LAB_00172d16:
            pTemplate->iSortIdx = uVar11;
            pTemplate->rRun = (short)((pIdx->szIdxRow * 0xf) / (int)pTVar7->szTabRow) + LVar12 + 1;
            if (!bVar25) {
              iVar13 = (int)uVar20 + 0x10;
              LVar12 = (LogEst)iVar13;
              local_d0 = uVar20;
              if (0 < (local_c0->sWC).nTerm) {
                iVar16 = pSVar6->a[bVar2].iCursor;
                lVar23 = 0x14;
                lVar24 = 0;
                do {
                  pWVar8 = (local_c0->sWC).a;
                  iVar15 = sqlite3ExprCoveredByIndex
                                     (*(Expr **)((long)pWVar8 + lVar23 + -0x14),iVar16,pIdx);
                  if (iVar15 != 0) {
                    uVar5 = *(ushort *)((long)pWVar8 + lVar23 + -4);
                    uVar17 = (uint)uVar5;
                    if (0 < (short)uVar5) {
                      uVar17 = -(uint)((*(byte *)((long)&pWVar8->pExpr + lVar23) & 0x82) == 0) |
                               0xffec;
                    }
                    iVar13 = uVar17 + iVar13;
                  }
                  LVar12 = (LogEst)iVar13;
                  if (iVar15 == 0) break;
                  lVar24 = lVar24 + 1;
                  lVar23 = lVar23 + 0x40;
                } while (lVar24 < (local_c0->sWC).nTerm);
              }
              LVar12 = sqlite3LogEstAdd(pTemplate->rRun,LVar12);
              pTemplate->rRun = LVar12;
              uVar20 = local_d0;
            }
            whereLoopOutputAdjust(local_c8,pTemplate,(LogEst)uVar20);
            iVar13 = whereLoopInsert(pBuilder,pTemplate);
            pTemplate->nOut = (LogEst)uVar20;
            if (iVar13 == 0) goto LAB_00172e56;
            bVar10 = false;
          }
          if (!bVar10) {
            return iVar13;
          }
        }
        pBuilder->bldFlags = 0;
        iVar13 = whereLoopAddBtreeIndex(pBuilder,pSVar6->a + bVar2,pIdx,0);
        if (pBuilder->bldFlags == 1) {
          pbVar1 = (byte *)((long)&pTVar7->tabFlags + 1);
          *pbVar1 = *pbVar1 | 1;
        }
        if (pSVar6->a[bVar2].pIBIndex != (Index *)0x0) {
          return iVar13;
        }
      }
      else {
        iVar13 = 0;
      }
      if (iVar13 != 0) {
        return iVar13;
      }
      pIdx = pIdx->pNext;
      local_fc = local_fc + 1;
      iVar15 = 0;
    } while (pIdx != (Index *)0x0);
  }
  return iVar15;
}

Assistant:

static int whereLoopAddBtree(
  WhereLoopBuilder *pBuilder, /* WHERE clause information */
  Bitmask mPrereq             /* Extra prerequesites for using this table */
){
  WhereInfo *pWInfo;          /* WHERE analysis context */
  Index *pProbe;              /* An index we are evaluating */
  Index sPk;                  /* A fake index object for the primary key */
  LogEst aiRowEstPk[2];       /* The aiRowLogEst[] value for the sPk index */
  i16 aiColumnPk = -1;        /* The aColumn[] value for the sPk index */
  SrcList *pTabList;          /* The FROM clause */
  struct SrcList_item *pSrc;  /* The FROM clause btree term to add */
  WhereLoop *pNew;            /* Template WhereLoop object */
  int rc = SQLITE_OK;         /* Return code */
  int iSortIdx = 1;           /* Index number */
  int b;                      /* A boolean value */
  LogEst rSize;               /* number of rows in the table */
  LogEst rLogSize;            /* Logarithm of the number of rows in the table */
  WhereClause *pWC;           /* The parsed WHERE clause */
  Table *pTab;                /* Table being queried */
  
  pNew = pBuilder->pNew;
  pWInfo = pBuilder->pWInfo;
  pTabList = pWInfo->pTabList;
  pSrc = pTabList->a + pNew->iTab;
  pTab = pSrc->pTab;
  pWC = pBuilder->pWC;
  assert( !IsVirtual(pSrc->pTab) );

  if( pSrc->pIBIndex ){
    /* An INDEXED BY clause specifies a particular index to use */
    pProbe = pSrc->pIBIndex;
  }else if( !HasRowid(pTab) ){
    pProbe = pTab->pIndex;
  }else{
    /* There is no INDEXED BY clause.  Create a fake Index object in local
    ** variable sPk to represent the rowid primary key index.  Make this
    ** fake index the first in a chain of Index objects with all of the real
    ** indices to follow */
    Index *pFirst;                  /* First of real indices on the table */
    memset(&sPk, 0, sizeof(Index));
    sPk.nKeyCol = 1;
    sPk.nColumn = 1;
    sPk.aiColumn = &aiColumnPk;
    sPk.aiRowLogEst = aiRowEstPk;
    sPk.onError = OE_Replace;
    sPk.pTable = pTab;
    sPk.szIdxRow = pTab->szTabRow;
    aiRowEstPk[0] = pTab->nRowLogEst;
    aiRowEstPk[1] = 0;
    pFirst = pSrc->pTab->pIndex;
    if( pSrc->fg.notIndexed==0 ){
      /* The real indices of the table are only considered if the
      ** NOT INDEXED qualifier is omitted from the FROM clause */
      sPk.pNext = pFirst;
    }
    pProbe = &sPk;
  }
  rSize = pTab->nRowLogEst;
  rLogSize = estLog(rSize);

#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
  /* Automatic indexes */
  if( !pBuilder->pOrSet      /* Not part of an OR optimization */
   && (pWInfo->wctrlFlags & WHERE_OR_SUBCLAUSE)==0
   && (pWInfo->pParse->db->flags & SQLITE_AutoIndex)!=0
   && pSrc->pIBIndex==0      /* Has no INDEXED BY clause */
   && !pSrc->fg.notIndexed   /* Has no NOT INDEXED clause */
   && HasRowid(pTab)         /* Not WITHOUT ROWID table. (FIXME: Why not?) */
   && !pSrc->fg.isCorrelated /* Not a correlated subquery */
   && !pSrc->fg.isRecursive  /* Not a recursive common table expression. */
  ){
    /* Generate auto-index WhereLoops */
    WhereTerm *pTerm;
    WhereTerm *pWCEnd = pWC->a + pWC->nTerm;
    for(pTerm=pWC->a; rc==SQLITE_OK && pTerm<pWCEnd; pTerm++){
      if( pTerm->prereqRight & pNew->maskSelf ) continue;
      if( termCanDriveIndex(pTerm, pSrc, 0) ){
        pNew->u.btree.nEq = 1;
        pNew->nSkip = 0;
        pNew->u.btree.pIndex = 0;
        pNew->nLTerm = 1;
        pNew->aLTerm[0] = pTerm;
        /* TUNING: One-time cost for computing the automatic index is
        ** estimated to be X*N*log2(N) where N is the number of rows in
        ** the table being indexed and where X is 7 (LogEst=28) for normal
        ** tables or 1.375 (LogEst=4) for views and subqueries.  The value
        ** of X is smaller for views and subqueries so that the query planner
        ** will be more aggressive about generating automatic indexes for
        ** those objects, since there is no opportunity to add schema
        ** indexes on subqueries and views. */
        pNew->rSetup = rLogSize + rSize + 4;
        if( pTab->pSelect==0 && (pTab->tabFlags & TF_Ephemeral)==0 ){
          pNew->rSetup += 24;
        }
        ApplyCostMultiplier(pNew->rSetup, pTab->costMult);
        if( pNew->rSetup<0 ) pNew->rSetup = 0;
        /* TUNING: Each index lookup yields 20 rows in the table.  This
        ** is more than the usual guess of 10 rows, since we have no way
        ** of knowing how selective the index will ultimately be.  It would
        ** not be unreasonable to make this value much larger. */
        pNew->nOut = 43;  assert( 43==sqlite3LogEst(20) );
        pNew->rRun = sqlite3LogEstAdd(rLogSize,pNew->nOut);
        pNew->wsFlags = WHERE_AUTO_INDEX;
        pNew->prereq = mPrereq | pTerm->prereqRight;
        rc = whereLoopInsert(pBuilder, pNew);
      }
    }
  }
#endif /* SQLITE_OMIT_AUTOMATIC_INDEX */

  /* Loop over all indices
  */
  for(; rc==SQLITE_OK && pProbe; pProbe=pProbe->pNext, iSortIdx++){
    if( pProbe->pPartIdxWhere!=0
     && !whereUsablePartialIndex(pSrc->iCursor, pWC, pProbe->pPartIdxWhere) ){
      testcase( pNew->iTab!=pSrc->iCursor );  /* See ticket [98d973b8f5] */
      continue;  /* Partial index inappropriate for this query */
    }
    rSize = pProbe->aiRowLogEst[0];
    pNew->u.btree.nEq = 0;
    pNew->u.btree.nBtm = 0;
    pNew->u.btree.nTop = 0;
    pNew->nSkip = 0;
    pNew->nLTerm = 0;
    pNew->iSortIdx = 0;
    pNew->rSetup = 0;
    pNew->prereq = mPrereq;
    pNew->nOut = rSize;
    pNew->u.btree.pIndex = pProbe;
    b = indexMightHelpWithOrderBy(pBuilder, pProbe, pSrc->iCursor);
    /* The ONEPASS_DESIRED flags never occurs together with ORDER BY */
    assert( (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0 || b==0 );
    if( pProbe->tnum<=0 ){
      /* Integer primary key index */
      pNew->wsFlags = WHERE_IPK;

      /* Full table scan */
      pNew->iSortIdx = b ? iSortIdx : 0;
      /* TUNING: Cost of full table scan is (N*3.0). */
      pNew->rRun = rSize + 16;
      ApplyCostMultiplier(pNew->rRun, pTab->costMult);
      whereLoopOutputAdjust(pWC, pNew, rSize);
      rc = whereLoopInsert(pBuilder, pNew);
      pNew->nOut = rSize;
      if( rc ) break;
    }else{
      Bitmask m;
      if( pProbe->isCovering ){
        pNew->wsFlags = WHERE_IDX_ONLY | WHERE_INDEXED;
        m = 0;
      }else{
        m = pSrc->colUsed & ~columnsInIndex(pProbe);
        pNew->wsFlags = (m==0) ? (WHERE_IDX_ONLY|WHERE_INDEXED) : WHERE_INDEXED;
      }

      /* Full scan via index */
      if( b
       || !HasRowid(pTab)
       || pProbe->pPartIdxWhere!=0
       || ( m==0
         && pProbe->bUnordered==0
         && (pProbe->szIdxRow<pTab->szTabRow)
         && (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0
         && sqlite3GlobalConfig.bUseCis
         && OptimizationEnabled(pWInfo->pParse->db, SQLITE_CoverIdxScan)
          )
      ){
        pNew->iSortIdx = b ? iSortIdx : 0;

        /* The cost of visiting the index rows is N*K, where K is
        ** between 1.1 and 3.0, depending on the relative sizes of the
        ** index and table rows. */
        pNew->rRun = rSize + 1 + (15*pProbe->szIdxRow)/pTab->szTabRow;
        if( m!=0 ){
          /* If this is a non-covering index scan, add in the cost of
          ** doing table lookups.  The cost will be 3x the number of
          ** lookups.  Take into account WHERE clause terms that can be
          ** satisfied using just the index, and that do not require a
          ** table lookup. */
          LogEst nLookup = rSize + 16;  /* Base cost:  N*3 */
          int ii;
          int iCur = pSrc->iCursor;
          WhereClause *pWC2 = &pWInfo->sWC;
          for(ii=0; ii<pWC2->nTerm; ii++){
            WhereTerm *pTerm = &pWC2->a[ii];
            if( !sqlite3ExprCoveredByIndex(pTerm->pExpr, iCur, pProbe) ){
              break;
            }
            /* pTerm can be evaluated using just the index.  So reduce
            ** the expected number of table lookups accordingly */
            if( pTerm->truthProb<=0 ){
              nLookup += pTerm->truthProb;
            }else{
              nLookup--;
              if( pTerm->eOperator & (WO_EQ|WO_IS) ) nLookup -= 19;
            }
          }
          
          pNew->rRun = sqlite3LogEstAdd(pNew->rRun, nLookup);
        }
        ApplyCostMultiplier(pNew->rRun, pTab->costMult);
        whereLoopOutputAdjust(pWC, pNew, rSize);
        rc = whereLoopInsert(pBuilder, pNew);
        pNew->nOut = rSize;
        if( rc ) break;
      }
    }

    pBuilder->bldFlags = 0;
    rc = whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, 0);
    if( pBuilder->bldFlags==SQLITE_BLDF_INDEXED ){
      /* If a non-unique index is used, or if a prefix of the key for
      ** unique index is used (making the index functionally non-unique)
      ** then the sqlite_stat1 data becomes important for scoring the
      ** plan */
      pTab->tabFlags |= TF_StatsUsed;
    }
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    sqlite3Stat4ProbeFree(pBuilder->pRec);
    pBuilder->nRecValid = 0;
    pBuilder->pRec = 0;
#endif

    /* If there was an INDEXED BY clause, then only that one index is
    ** considered. */
    if( pSrc->pIBIndex ) break;
  }
  return rc;
}